

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::TParseContext::constructBuiltIn
          (TParseContext *this,TType *type,TOperator op,TIntermTyped *node,TSourceLoc *loc,
          bool subset)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  TBasicType TVar5;
  TOperator TVar6;
  TBasicType src;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  TSourceLoc *loc_00;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  TIntermTyped *pTVar7;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  long *plVar8;
  long lVar9;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  undefined4 extraout_var_46;
  undefined4 extraout_var_47;
  undefined4 extraout_var_48;
  undefined4 extraout_var_49;
  undefined4 extraout_var_50;
  TIntermUnary *pTVar10;
  undefined4 extraout_var_51;
  undefined4 extraout_var_52;
  undefined4 extraout_var_53;
  undefined4 extraout_var_54;
  undefined4 extraout_var_55;
  char *pcVar11;
  char *pcVar12;
  TIntermediate *pTVar13;
  _func_int **pp_Var14;
  TOperator op_local;
  TIntermTyped *local_d0;
  TType transitionType;
  undefined4 extraout_var_17;
  
  op_local = op;
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0xe0))
                    ((long *)CONCAT44(extraout_var,iVar3));
  if ((cVar1 != '\0') &&
     ((iVar3 = (*type->_vptr_TType[0x18])(type), (char)iVar3 != '\0' ||
      (iVar3 = (*type->_vptr_TType[0x1b])(type), (char)iVar3 != '\0')))) {
    iVar3 = (*type->_vptr_TType[0x26])(type);
    iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
    cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x130))
                      ((long *)CONCAT44(extraout_var_00,iVar4));
    if ((char)iVar3 != cVar1) {
      TVar5 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
      iVar3 = (*type->_vptr_TType[0xc])(type);
      iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x2b])(node);
      local_d0 = node;
      TType::TType(&transitionType,TVar5,EvqTemporary,iVar3,0,0,SUB41(iVar4,0));
      TVar6 = TIntermediate::mapTypeToConstructorOp
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         &transitionType);
      node = constructBuiltIn(this,&transitionType,TVar6,local_d0,loc,false);
    }
  }
  switch(op) {
  case EOpConstructInt:
  case EOpConstructIVec2:
  case EOpConstructIVec3:
  case EOpConstructIVec4:
    TVar6 = EOpConstructInt;
    break;
  case EOpConstructUint:
  case EOpConstructUVec3:
  case EOpConstructUVec4:
    goto switchD_00424d52_caseD_171;
  case EOpConstructInt8:
  case EOpConstructI8Vec2:
  case EOpConstructI8Vec3:
  case EOpConstructI8Vec4:
    TVar6 = EOpConstructInt8;
    if ((((((this->super_TParseContextBase).super_TParseVersions.intermediate)->numericFeatures).
          features & 3) == 0) &&
       (iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node), iVar3 != 4)) {
      iVar3 = (*type->_vptr_TType[0xc])(type);
      TType::TType(&transitionType,EbtInt,EvqTemporary,iVar3,0,0,false);
      iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
      bVar2 = TType::operator!=(&transitionType,(TType *)CONCAT44(extraout_var_03,iVar3));
      if (bVar2) {
        TVar6 = EOpConstructInt;
        if (op != EOpConstructInt8) {
          TVar6 = op + EOpPostIncrement;
        }
        pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
        node = TIntermediate::setAggregateOperator
                         (pTVar13,&node->super_TIntermNode,TVar6,&transitionType,
                          (TSourceLoc *)CONCAT44(extraout_var_04,iVar3));
      }
      pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      TVar5 = EbtInt8;
LAB_0042511a:
      pTVar7 = TIntermediate::addConversion(pTVar13,TVar5,node);
      return pTVar7;
    }
    break;
  case EOpConstructUint8:
  case EOpConstructU8Vec2:
  case EOpConstructU8Vec3:
  case EOpConstructU8Vec4:
    TVar6 = EOpConstructUint8;
    if ((((((this->super_TParseContextBase).super_TParseVersions.intermediate)->numericFeatures).
          features & 3) == 0) &&
       (iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node), iVar3 != 5)) {
      iVar3 = (*type->_vptr_TType[0xc])(type);
      TType::TType(&transitionType,EbtUint,EvqTemporary,iVar3,0,0,false);
      iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
      bVar2 = TType::operator!=(&transitionType,(TType *)CONCAT44(extraout_var_09,iVar3));
      if (bVar2) {
        TVar6 = EOpConstructUint;
        if (op != EOpConstructUint8) {
          TVar6 = op + EOpPostIncrement;
        }
        pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
        node = TIntermediate::setAggregateOperator
                         (pTVar13,&node->super_TIntermNode,TVar6,&transitionType,
                          (TSourceLoc *)CONCAT44(extraout_var_10,iVar3));
      }
      pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      TVar5 = EbtUint8;
      goto LAB_0042511a;
    }
    break;
  case EOpConstructInt16:
  case EOpConstructI16Vec2:
  case EOpConstructI16Vec3:
  case EOpConstructI16Vec4:
    TVar6 = EOpConstructInt16;
    if ((((((this->super_TParseContextBase).super_TParseVersions.intermediate)->numericFeatures).
          features & 0x405) == 0) &&
       (iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node), iVar3 != 6)) {
      iVar3 = (*type->_vptr_TType[0xc])(type);
      TType::TType(&transitionType,EbtInt,EvqTemporary,iVar3,0,0,false);
      iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
      bVar2 = TType::operator!=(&transitionType,(TType *)CONCAT44(extraout_var_05,iVar3));
      if (bVar2) {
        TVar6 = EOpConstructInt;
        if (op != EOpConstructInt16) {
          TVar6 = op + EOpParameters;
        }
        pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
        node = TIntermediate::setAggregateOperator
                         (pTVar13,&node->super_TIntermNode,TVar6,&transitionType,
                          (TSourceLoc *)CONCAT44(extraout_var_06,iVar3));
      }
      pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      TVar5 = EbtInt16;
      goto LAB_0042511a;
    }
    break;
  case EOpConstructUint16:
  case EOpConstructU16Vec2:
  case EOpConstructU16Vec3:
  case EOpConstructU16Vec4:
    TVar6 = EOpConstructUint16;
    if ((((((this->super_TParseContextBase).super_TParseVersions.intermediate)->numericFeatures).
          features & 0x405) == 0) &&
       (iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node), iVar3 != 7)) {
      iVar3 = (*type->_vptr_TType[0xc])(type);
      TType::TType(&transitionType,EbtUint,EvqTemporary,iVar3,0,0,false);
      iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
      bVar2 = TType::operator!=(&transitionType,(TType *)CONCAT44(extraout_var_07,iVar3));
      if (bVar2) {
        TVar6 = EOpConstructUint;
        if (op != EOpConstructUint16) {
          TVar6 = op + EOpParameters;
        }
        pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
        node = TIntermediate::setAggregateOperator
                         (pTVar13,&node->super_TIntermNode,TVar6,&transitionType,
                          (TSourceLoc *)CONCAT44(extraout_var_08,iVar3));
      }
      pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      TVar5 = EbtUint16;
      goto LAB_0042511a;
    }
    break;
  case EOpConstructInt64:
  case EOpConstructI64Vec2:
  case EOpConstructI64Vec3:
  case EOpConstructI64Vec4:
    TVar6 = EOpConstructInt64;
    break;
  case EOpConstructUint64:
    iVar3 = (*type->_vptr_TType[0x18])(type);
    if ((char)iVar3 != '\0') {
      iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
      iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_30,iVar3) + 0x38))
                        ((long *)CONCAT44(extraout_var_30,iVar3));
      if (iVar3 == 0x12) {
        pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
        loc_00 = (TSourceLoc *)CONCAT44(extraout_var_31,iVar3);
        TVar6 = EOpConvPtrToUint64;
        goto LAB_004253dd;
      }
    }
  case EOpConstructU64Vec2:
  case EOpConstructU64Vec3:
  case EOpConstructU64Vec4:
    TVar6 = EOpConstructUint64;
    break;
  case EOpConstructBool:
  case EOpConstructBVec2:
  case EOpConstructBVec3:
  case EOpConstructBVec4:
    TVar6 = EOpConstructBool;
    break;
  case EOpConstructFloat:
  case EOpConstructVec2:
  case EOpConstructVec3:
  case EOpConstructVec4:
  case EOpConstructMat2x2:
  case EOpConstructMat2x3:
  case EOpConstructMat2x4:
  case EOpConstructMat3x2:
  case EOpConstructMat3x3:
  case EOpConstructMat3x4:
  case EOpConstructMat4x2:
  case EOpConstructMat4x3:
  case EOpConstructMat4x4:
    TVar6 = EOpConstructFloat;
    break;
  case EOpConstructDouble:
  case EOpConstructDVec2:
  case EOpConstructDVec3:
  case EOpConstructDVec4:
  case EOpConstructDMat2x2:
  case EOpConstructDMat2x3:
  case EOpConstructDMat2x4:
  case EOpConstructDMat3x2:
  case EOpConstructDMat3x3:
  case EOpConstructDMat3x4:
  case EOpConstructDMat4x2:
  case EOpConstructDMat4x3:
  case EOpConstructDMat4x4:
switchD_00424d52_caseD_17a:
    TVar6 = EOpConstructDouble;
    break;
  case EOpConstructUVec2:
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
    iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_18,iVar3) + 0x38))
                      ((long *)CONCAT44(extraout_var_18,iVar3));
    if (iVar3 == 0x12) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,1,&E_GL_EXT_buffer_reference_uvec2,"reference conversion to uvec2");
      pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
      loc_00 = (TSourceLoc *)CONCAT44(extraout_var_19,iVar3);
      TVar6 = EOpConvPtrToUvec2;
      goto LAB_004253dd;
    }
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
    iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_41,iVar3) + 0x38))
                      ((long *)CONCAT44(extraout_var_41,iVar3));
    if (iVar3 == 0xe) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,1,&E_GL_ARB_bindless_texture,"sampler conversion to uvec2");
      pTVar7 = TIntermediate::createConversion
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,EbtUint,
                          node);
      iVar3 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[3])(pTVar7);
      lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_42,iVar3) + 0xf8))
                        ((long *)CONCAT44(extraout_var_42,iVar3));
      *(uint *)(lVar9 + 8) = *(uint *)(lVar9 + 8) & 0xfffff0ff | 0x200;
      pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
      loc_00 = (TSourceLoc *)CONCAT44(extraout_var_43,iVar3);
      TVar6 = EOpConstructUVec2;
      bVar2 = false;
      goto LAB_004253e0;
    }
    goto switchD_00424d52_caseD_171;
  default:
    pp_Var14 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar12 = "unsupported construction";
    pcVar11 = "";
    goto LAB_004256ef;
  case EOpConstructFloat16:
  case EOpConstructF16Vec2:
  case EOpConstructF16Vec3:
  case EOpConstructF16Vec4:
  case EOpConstructF16Mat2x2:
  case EOpConstructF16Mat2x3:
  case EOpConstructF16Mat2x4:
  case EOpConstructF16Mat3x2:
  case EOpConstructF16Mat3x3:
  case EOpConstructF16Mat3x4:
  case EOpConstructF16Mat4x2:
  case EOpConstructF16Mat4x3:
  case EOpConstructF16Mat4x4:
    TVar6 = EOpConstructFloat16;
    if ((((((this->super_TParseContextBase).super_TParseVersions.intermediate)->numericFeatures).
          features & 0x821) == 0) &&
       (iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node), iVar3 != 3)) {
      iVar3 = (*type->_vptr_TType[0xc])(type);
      TType::TType(&transitionType,EbtFloat,EvqTemporary,iVar3,0,0,false);
      iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
      bVar2 = TType::operator!=(&transitionType,(TType *)CONCAT44(extraout_var_01,iVar3));
      if (bVar2) {
        TVar6 = EOpConstructFloat;
        if (op != EOpConstructFloat16) {
          TVar6 = op - EOpSign;
        }
        pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
        node = TIntermediate::setAggregateOperator
                         (pTVar13,&node->super_TIntermNode,TVar6,&transitionType,
                          (TSourceLoc *)CONCAT44(extraout_var_02,iVar3));
      }
      pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      TVar5 = EbtFloat16;
      goto LAB_0042511a;
    }
    break;
  case EOpConstructTextureSampler:
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
    iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_26,iVar3) + 0x38))
                      ((long *)CONCAT44(extraout_var_26,iVar3));
    if (iVar3 != 9) {
      iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
      iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_27,iVar3) + 0x38))
                        ((long *)CONCAT44(extraout_var_27,iVar3));
      if (iVar3 != 8) goto switchD_00424d52_caseD_17a;
    }
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
    iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_28,iVar3) + 0x60))
                      ((long *)CONCAT44(extraout_var_28,iVar3));
    if (iVar3 != 2) goto switchD_00424d52_caseD_17a;
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_ARB_bindless_texture,"ivec2/uvec2 convert to texture handle");
    pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
    loc_00 = (TSourceLoc *)CONCAT44(extraout_var_29,iVar3);
    TVar6 = EOpPackUint2x32;
    goto LAB_004253dd;
  case EOpConstructNonuniform:
    pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
    loc_00 = (TSourceLoc *)CONCAT44(extraout_var_17,iVar3);
    TVar6 = EOpCopyObject;
    goto LAB_004253dd;
  case EOpConstructReference:
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
    iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_20,iVar3) + 0x38))
                      ((long *)CONCAT44(extraout_var_20,iVar3));
    if (iVar3 == 0x12) {
      pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
      loc_00 = (TSourceLoc *)CONCAT44(extraout_var_21,iVar3);
      TVar6 = EOpConstructReference;
    }
    else {
      iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
      cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_46,iVar3) + 0xc0))
                        ((long *)CONCAT44(extraout_var_46,iVar3));
      if (cVar1 != '\0') {
        iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
        iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_47,iVar3) + 0x38))
                          ((long *)CONCAT44(extraout_var_47,iVar3));
        if (iVar3 == 0xb) {
          pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
          loc_00 = (TSourceLoc *)CONCAT44(extraout_var_48,iVar3);
          TVar6 = EOpConvUint64ToPtr;
          goto LAB_004253dd;
        }
      }
      iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
      cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_51,iVar3) + 0xd8))
                        ((long *)CONCAT44(extraout_var_51,iVar3));
      if (cVar1 == '\0') {
        return (TIntermTyped *)0x0;
      }
      iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
      iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_52,iVar3) + 0x38))
                        ((long *)CONCAT44(extraout_var_52,iVar3));
      if (iVar3 != 9) {
        return (TIntermTyped *)0x0;
      }
      iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x26])(node);
      if (iVar3 != 2) {
        return (TIntermTyped *)0x0;
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,1,&E_GL_EXT_buffer_reference_uvec2,"uvec2 conversion to reference");
      pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
      loc_00 = (TSourceLoc *)CONCAT44(extraout_var_53,iVar3);
      TVar6 = EOpConvUvec2ToPtr;
    }
    goto LAB_004253dd;
  case EOpConstructCooperativeMatrixNV:
  case EOpConstructCooperativeMatrixKHR:
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
    bVar2 = TType::operator==((TType *)CONCAT44(extraout_var_11,iVar3),type);
    if (bVar2) {
      return node;
    }
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
    if ((*(byte *)(CONCAT44(extraout_var_12,iVar3) + 10) & 0x60) == 0) {
      iVar3 = (*type->_vptr_TType[7])(type);
      iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
      iVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_54,iVar4) + 0x38))
                        ((long *)CONCAT44(extraout_var_54,iVar4));
      if (iVar3 != iVar4) {
        pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        TVar5 = (*type->_vptr_TType[7])(type);
        node = TIntermediate::addConversion(pTVar13,TVar5,node);
        if (node == (TIntermTyped *)0x0) {
          return (TIntermTyped *)0x0;
        }
      }
      pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
      loc = (TSourceLoc *)CONCAT44(extraout_var_55,iVar3);
    }
    else {
      iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
      bVar2 = TType::sameCoopMatShape(type,(TType *)CONCAT44(extraout_var_13,iVar3));
      if ((!bVar2) ||
         (iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node),
         ((*(uint *)(CONCAT44(extraout_var_14,iVar3) + 8) ^ *(uint *)&type->field_0x8) & 0x3800000)
         == 0)) {
LAB_00425553:
        pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
        pTVar10 = TIntermediate::addUnaryNode
                            (pTVar13,EOpConvNumeric,node,
                             (TSourceLoc *)CONCAT44(extraout_var_38,iVar3),type);
        iVar3 = (*(pTVar10->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[7])(pTVar10);
        plVar8 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_39,iVar3) + 0x188))
                                   ((long *)CONCAT44(extraout_var_39,iVar3));
        lVar9 = (**(code **)(*plVar8 + 0x28))(plVar8);
        if (lVar9 != 0) {
          iVar3 = (*(pTVar10->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[7])(pTVar10);
          plVar8 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_40,iVar3) + 0x188))
                                     ((long *)CONCAT44(extraout_var_40,iVar3));
          plVar8 = (long *)(**(code **)(*plVar8 + 0x28))(plVar8);
          iVar3 = (*(pTVar10->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x1e])(pTVar10);
          pTVar7 = (TIntermTyped *)(**(code **)(*plVar8 + 0x188))(plVar8,0x12,iVar3);
          return pTVar7;
        }
        return (TIntermTyped *)pTVar10;
      }
      iVar3 = (*type->_vptr_TType[7])(type);
      iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
      iVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_15,iVar4) + 0x38))
                        ((long *)CONCAT44(extraout_var_15,iVar4));
      if (iVar3 != iVar4) goto LAB_00425553;
      pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
      loc = (TSourceLoc *)CONCAT44(extraout_var_16,iVar3);
    }
    goto LAB_0042570c;
  case EOpConstructCooperativeVectorNV:
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
    if ((*(byte *)(CONCAT44(extraout_var_22,iVar3) + 0xb) & 8) == 0) {
      iVar3 = (*type->_vptr_TType[7])(type);
      iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
      iVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_23,iVar4) + 0x38))
                        ((long *)CONCAT44(extraout_var_23,iVar4));
      if (iVar3 != iVar4) {
        pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        TVar5 = (*type->_vptr_TType[7])(type);
        node = TIntermediate::addConversion(pTVar13,TVar5,node);
        if (node == (TIntermTyped *)0x0) {
          return (TIntermTyped *)0x0;
        }
      }
    }
    iVar3 = (*type->_vptr_TType[7])(type);
    iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
    iVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_24,iVar4) + 0x38))
                      ((long *)CONCAT44(extraout_var_24,iVar4));
    op = op_local;
    if (iVar3 != iVar4) {
      pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      TVar5 = (*type->_vptr_TType[7])(type);
      iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
      src = (**(code **)(*(long *)CONCAT44(extraout_var_49,iVar3) + 0x38))
                      ((long *)CONCAT44(extraout_var_49,iVar3));
      TIntermediate::buildConvertOp(pTVar13,TVar5,src,&op_local);
      TVar6 = op_local;
      pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
      pTVar10 = TIntermediate::addUnaryNode
                          (pTVar13,TVar6,node,(TSourceLoc *)CONCAT44(extraout_var_50,iVar3),type);
      return (TIntermTyped *)pTVar10;
    }
    if (subset) {
      return node;
    }
    pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
    loc = (TSourceLoc *)CONCAT44(extraout_var_25,iVar3);
    goto LAB_0042570c;
  case EOpConstructAccStruct:
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
    cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_32,iVar3) + 0xc0))
                      ((long *)CONCAT44(extraout_var_32,iVar3));
    if (cVar1 != '\0') {
      iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
      iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_33,iVar3) + 0x38))
                        ((long *)CONCAT44(extraout_var_33,iVar3));
      if (iVar3 == 0xb) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                  (this,loc,2,ray_tracing_EXTs,"uint64_t conversion to acclerationStructureEXT");
        pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
        loc_00 = (TSourceLoc *)CONCAT44(extraout_var_34,iVar3);
        TVar6 = EOpConvUint64ToAccStruct;
        goto LAB_004253dd;
      }
    }
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
    cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_35,iVar3) + 0xd8))
                      ((long *)CONCAT44(extraout_var_35,iVar3));
    if (cVar1 == '\0') {
      return (TIntermTyped *)0x0;
    }
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
    iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_36,iVar3) + 0x38))
                      ((long *)CONCAT44(extraout_var_36,iVar3));
    if (iVar3 != 9) {
      return (TIntermTyped *)0x0;
    }
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x26])(node);
    if (iVar3 != 2) {
      return (TIntermTyped *)0x0;
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,2,ray_tracing_EXTs,"uvec2 conversion to accelerationStructureEXT");
    pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
    loc_00 = (TSourceLoc *)CONCAT44(extraout_var_37,iVar3);
    TVar6 = EOpConvUvec2ToAccStruct;
LAB_004253dd:
    bVar2 = true;
    pTVar7 = node;
LAB_004253e0:
    pTVar7 = TIntermediate::addBuiltInFunctionCall
                       (pTVar13,loc_00,TVar6,bVar2,&pTVar7->super_TIntermNode,type);
    return pTVar7;
  }
LAB_0042567a:
  pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
  pTVar7 = TIntermediate::addUnaryMath
                     (pTVar13,TVar6,node,(TSourceLoc *)CONCAT44(extraout_var_44,iVar3));
  if (pTVar7 == (TIntermTyped *)0x0) {
    pp_Var14 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar12 = "can\'t convert";
    pcVar11 = "constructor";
LAB_004256ef:
    pTVar7 = (TIntermTyped *)0x0;
    (*pp_Var14[0x2d])(this,loc,pcVar12,pcVar11,"");
  }
  else if (!subset) {
    if (pTVar7 != node) {
      iVar3 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar7);
      bVar2 = TType::operator==((TType *)CONCAT44(extraout_var_45,iVar3),type);
      if (bVar2) {
        return pTVar7;
      }
    }
    pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    node = pTVar7;
LAB_0042570c:
    pTVar7 = TIntermediate::setAggregateOperator(pTVar13,&node->super_TIntermNode,op,type,loc);
  }
  return pTVar7;
switchD_00424d52_caseD_171:
  TVar6 = EOpConstructUint;
  goto LAB_0042567a;
}

Assistant:

TIntermTyped* TParseContext::constructBuiltIn(const TType& type, TOperator op, TIntermTyped* node, const TSourceLoc& loc,
    bool subset)
{
    // If we are changing a matrix in both domain of basic type and to a non matrix,
    // do the shape change first (by default, below, basic type is changed before shape).
    // This avoids requesting a matrix of a new type that is going to be discarded anyway.
    // TODO: This could be generalized to more type combinations, but that would require
    // more extensive testing and full algorithm rework. For now, the need to do two changes makes
    // the recursive call work, and avoids the most egregious case of creating integer matrices.
    if (node->getType().isMatrix() && (type.isScalar() || type.isVector()) &&
            type.isFloatingDomain() != node->getType().isFloatingDomain()) {
        TType transitionType(node->getBasicType(), glslang::EvqTemporary, type.getVectorSize(), 0, 0, node->isVector());
        TOperator transitionOp = intermediate.mapTypeToConstructorOp(transitionType);
        node = constructBuiltIn(transitionType, transitionOp, node, loc, false);
    }

    TIntermTyped* newNode;
    TOperator basicOp;

    //
    // First, convert types as needed.
    //
    switch (op) {
    case EOpConstructVec2:
    case EOpConstructVec3:
    case EOpConstructVec4:
    case EOpConstructMat2x2:
    case EOpConstructMat2x3:
    case EOpConstructMat2x4:
    case EOpConstructMat3x2:
    case EOpConstructMat3x3:
    case EOpConstructMat3x4:
    case EOpConstructMat4x2:
    case EOpConstructMat4x3:
    case EOpConstructMat4x4:
    case EOpConstructFloat:
        basicOp = EOpConstructFloat;
        break;

    case EOpConstructIVec2:
    case EOpConstructIVec3:
    case EOpConstructIVec4:
    case EOpConstructInt:
        basicOp = EOpConstructInt;
        break;

    case EOpConstructUVec2:
        if (node->getType().getBasicType() == EbtReference) {
            requireExtensions(loc, 1, &E_GL_EXT_buffer_reference_uvec2, "reference conversion to uvec2");
            TIntermTyped* newNode = intermediate.addBuiltInFunctionCall(node->getLoc(), EOpConvPtrToUvec2, true, node,
                type);
            return newNode;
        } else if (node->getType().getBasicType() == EbtSampler) {
            requireExtensions(loc, 1, &E_GL_ARB_bindless_texture, "sampler conversion to uvec2");
            // force the basic type of the constructor param to uvec2, otherwise spv builder will
            // report some errors
            TIntermTyped* newSrcNode = intermediate.createConversion(EbtUint, node);
            newSrcNode->getAsTyped()->getWritableType().setVectorSize(2);

            TIntermTyped* newNode =
                intermediate.addBuiltInFunctionCall(node->getLoc(), EOpConstructUVec2, false, newSrcNode, type);
            return newNode;
        }
        [[fallthrough]];
    case EOpConstructUVec3:
    case EOpConstructUVec4:
    case EOpConstructUint:
        basicOp = EOpConstructUint;
        break;

    case EOpConstructBVec2:
    case EOpConstructBVec3:
    case EOpConstructBVec4:
    case EOpConstructBool:
        basicOp = EOpConstructBool;
        break;
    case EOpConstructTextureSampler:
        if ((node->getType().getBasicType() == EbtUint || node->getType().getBasicType() == EbtInt) &&
            node->getType().getVectorSize() == 2) {
            requireExtensions(loc, 1, &E_GL_ARB_bindless_texture, "ivec2/uvec2 convert to texture handle");
            // No matter ivec2 or uvec2, Set EOpPackUint2x32 just to generate an opBitcast op code
            TIntermTyped* newNode =
                intermediate.addBuiltInFunctionCall(node->getLoc(), EOpPackUint2x32, true, node, type);
            return newNode;
        }
        [[fallthrough]];
    case EOpConstructDVec2:
    case EOpConstructDVec3:
    case EOpConstructDVec4:
    case EOpConstructDMat2x2:
    case EOpConstructDMat2x3:
    case EOpConstructDMat2x4:
    case EOpConstructDMat3x2:
    case EOpConstructDMat3x3:
    case EOpConstructDMat3x4:
    case EOpConstructDMat4x2:
    case EOpConstructDMat4x3:
    case EOpConstructDMat4x4:
    case EOpConstructDouble:
        basicOp = EOpConstructDouble;
        break;

    case EOpConstructF16Vec2:
    case EOpConstructF16Vec3:
    case EOpConstructF16Vec4:
    case EOpConstructF16Mat2x2:
    case EOpConstructF16Mat2x3:
    case EOpConstructF16Mat2x4:
    case EOpConstructF16Mat3x2:
    case EOpConstructF16Mat3x3:
    case EOpConstructF16Mat3x4:
    case EOpConstructF16Mat4x2:
    case EOpConstructF16Mat4x3:
    case EOpConstructF16Mat4x4:
    case EOpConstructFloat16:
        basicOp = EOpConstructFloat16;
        // 8/16-bit storage extensions don't support direct constructing composites of 8/16-bit types,
        // so construct a 32-bit type and convert
        // and do not generate any conversion if it is an identity conversion, i.e. float16_t(<float16_t> var)
        if (!intermediate.getArithemeticFloat16Enabled() && (node->getBasicType() != EbtFloat16)) {
            TType tempType(EbtFloat, EvqTemporary, type.getVectorSize());
            newNode = node;
            if (tempType != newNode->getType()) {
                TOperator aggregateOp;
                if (op == EOpConstructFloat16)
                    aggregateOp = EOpConstructFloat;
                else
                    aggregateOp = (TOperator)(EOpConstructVec2 + op - EOpConstructF16Vec2);
                newNode = intermediate.setAggregateOperator(newNode, aggregateOp, tempType, node->getLoc());
            }
            newNode = intermediate.addConversion(EbtFloat16, newNode);
            return newNode;
        }
        break;

    case EOpConstructI8Vec2:
    case EOpConstructI8Vec3:
    case EOpConstructI8Vec4:
    case EOpConstructInt8:
        basicOp = EOpConstructInt8;
        // 8/16-bit storage extensions don't support direct constructing composites of 8/16-bit types,
        // so construct a 32-bit type and convert
        // and do not generate any conversion if it is an identity conversion, i.e. int8_t(<int8_t> var)
        if (!intermediate.getArithemeticInt8Enabled() && (node->getBasicType() != EbtInt8)) {
            TType tempType(EbtInt, EvqTemporary, type.getVectorSize());
            newNode = node;
            if (tempType != newNode->getType()) {
                TOperator aggregateOp;
                if (op == EOpConstructInt8)
                    aggregateOp = EOpConstructInt;
                else
                    aggregateOp = (TOperator)(EOpConstructIVec2 + op - EOpConstructI8Vec2);
                newNode = intermediate.setAggregateOperator(newNode, aggregateOp, tempType, node->getLoc());
            }
            newNode = intermediate.addConversion(EbtInt8, newNode);
            return newNode;
        }
        break;

    case EOpConstructU8Vec2:
    case EOpConstructU8Vec3:
    case EOpConstructU8Vec4:
    case EOpConstructUint8:
        basicOp = EOpConstructUint8;
        // 8/16-bit storage extensions don't support direct constructing composites of 8/16-bit types,
        // so construct a 32-bit type and convert
        // and do not generate any conversion if it is an identity conversion, i.e. uint8_t(<uint8_t> var)
        if (!intermediate.getArithemeticInt8Enabled() && (node->getBasicType() != EbtUint8)) {
            TType tempType(EbtUint, EvqTemporary, type.getVectorSize());
            newNode = node;
            if (tempType != newNode->getType()) {
                TOperator aggregateOp;
                if (op == EOpConstructUint8)
                    aggregateOp = EOpConstructUint;
                else
                    aggregateOp = (TOperator)(EOpConstructUVec2 + op - EOpConstructU8Vec2);
                newNode = intermediate.setAggregateOperator(newNode, aggregateOp, tempType, node->getLoc());
            }
            newNode = intermediate.addConversion(EbtUint8, newNode);
            return newNode;
        }
        break;

    case EOpConstructI16Vec2:
    case EOpConstructI16Vec3:
    case EOpConstructI16Vec4:
    case EOpConstructInt16:
        basicOp = EOpConstructInt16;
        // 8/16-bit storage extensions don't support direct constructing composites of 8/16-bit types,
        // so construct a 32-bit type and convert
        // and do not generate any conversion if it is an identity conversion, i.e. int16_t(<int16_t> var)
        if (!intermediate.getArithemeticInt16Enabled() && (node->getBasicType() != EbtInt16)) {
            TType tempType(EbtInt, EvqTemporary, type.getVectorSize());
            newNode = node;
            if (tempType != newNode->getType()) {
                TOperator aggregateOp;
                if (op == EOpConstructInt16)
                    aggregateOp = EOpConstructInt;
                else
                    aggregateOp = (TOperator)(EOpConstructIVec2 + op - EOpConstructI16Vec2);
                newNode = intermediate.setAggregateOperator(newNode, aggregateOp, tempType, node->getLoc());
            }
            newNode = intermediate.addConversion(EbtInt16, newNode);
            return newNode;
        }
        break;

    case EOpConstructU16Vec2:
    case EOpConstructU16Vec3:
    case EOpConstructU16Vec4:
    case EOpConstructUint16:
        basicOp = EOpConstructUint16;
        // 8/16-bit storage extensions don't support direct constructing composites of 8/16-bit types,
        // so construct a 32-bit type and convert
        // and do not generate any conversion if it is an identity conversion, i.e. uint16_t(<uint16_t> var)
        if (!intermediate.getArithemeticInt16Enabled() && (node->getBasicType() != EbtUint16)) {
            TType tempType(EbtUint, EvqTemporary, type.getVectorSize());
            newNode = node;
            if (tempType != newNode->getType()) {
                TOperator aggregateOp;
                if (op == EOpConstructUint16)
                    aggregateOp = EOpConstructUint;
                else
                    aggregateOp = (TOperator)(EOpConstructUVec2 + op - EOpConstructU16Vec2);
                newNode = intermediate.setAggregateOperator(newNode, aggregateOp, tempType, node->getLoc());
            }
            newNode = intermediate.addConversion(EbtUint16, newNode);
            return newNode;
        }
        break;

    case EOpConstructI64Vec2:
    case EOpConstructI64Vec3:
    case EOpConstructI64Vec4:
    case EOpConstructInt64:
        basicOp = EOpConstructInt64;
        break;

    case EOpConstructUint64:
        if (type.isScalar() && node->getType().isReference()) {
            TIntermTyped* newNode = intermediate.addBuiltInFunctionCall(node->getLoc(), EOpConvPtrToUint64, true, node, type);
            return newNode;
        }
        [[fallthrough]];
    case EOpConstructU64Vec2:
    case EOpConstructU64Vec3:
    case EOpConstructU64Vec4:
        basicOp = EOpConstructUint64;
        break;

    case EOpConstructNonuniform:
        // Make a nonuniform copy of node
        newNode = intermediate.addBuiltInFunctionCall(node->getLoc(), EOpCopyObject, true, node, type);
        return newNode;

    case EOpConstructReference:
        // construct reference from reference
        if (node->getType().isReference()) {
            newNode = intermediate.addBuiltInFunctionCall(node->getLoc(), EOpConstructReference, true, node, type);
            return newNode;
        // construct reference from uint64
        } else if (node->getType().isScalar() && node->getType().getBasicType() == EbtUint64) {
            TIntermTyped* newNode = intermediate.addBuiltInFunctionCall(node->getLoc(), EOpConvUint64ToPtr, true, node,
                type);
            return newNode;
        // construct reference from uvec2
        } else if (node->getType().isVector() && node->getType().getBasicType() == EbtUint &&
                   node->getVectorSize() == 2) {
            requireExtensions(loc, 1, &E_GL_EXT_buffer_reference_uvec2, "uvec2 conversion to reference");
            TIntermTyped* newNode = intermediate.addBuiltInFunctionCall(node->getLoc(), EOpConvUvec2ToPtr, true, node,
                type);
            return newNode;
        } else {
            return nullptr;
        }

    case EOpConstructCooperativeVectorNV:
        if (!node->getType().isCoopVecNV()) {
            if (type.getBasicType() != node->getType().getBasicType()) {
                node = intermediate.addConversion(type.getBasicType(), node);
                if (node == nullptr)
                    return nullptr;
            }
        }
        if (type.getBasicType() != node->getType().getBasicType()) {
            intermediate.buildConvertOp(type.getBasicType(), node->getType().getBasicType(), op);
            node = intermediate.addUnaryNode(op, node, node->getLoc(), type);
            return node;
        }
        if (subset) {
            return node;
        }

        node = intermediate.setAggregateOperator(node, op, type, node->getLoc());

        return node;

    case EOpConstructCooperativeMatrixNV:
    case EOpConstructCooperativeMatrixKHR:
        if (node->getType() == type) {
            return node;
        }
        if (!node->getType().isCoopMat()) {
            if (type.getBasicType() != node->getType().getBasicType()) {
                node = intermediate.addConversion(type.getBasicType(), node);
                if (node == nullptr)
                    return nullptr;
            }
            node = intermediate.setAggregateOperator(node, op, type, node->getLoc());
        } else if (type.sameCoopMatShape(node->getType()) && !type.sameCoopMatUse(node->getType()) &&
                   type.getBasicType() == node->getType().getBasicType()) {
            node = intermediate.setAggregateOperator(node, op, type, node->getLoc());
        } else {
            TOperator op = EOpConvNumeric;

            node = intermediate.addUnaryNode(op, node, node->getLoc(), type);
            // If it's a (non-specialization) constant, it must be folded.
            if (node->getAsUnaryNode()->getOperand()->getAsConstantUnion())
                return node->getAsUnaryNode()->getOperand()->getAsConstantUnion()->fold(op, node->getType());
        }

        return node;

    case EOpConstructAccStruct:
        if ((node->getType().isScalar() && node->getType().getBasicType() == EbtUint64)) {
            // construct acceleration structure from uint64
            requireExtensions(loc, Num_ray_tracing_EXTs, ray_tracing_EXTs, "uint64_t conversion to acclerationStructureEXT");
            return intermediate.addBuiltInFunctionCall(node->getLoc(), EOpConvUint64ToAccStruct, true, node,
                type);
        } else if (node->getType().isVector() && node->getType().getBasicType() == EbtUint && node->getVectorSize() == 2) {
            // construct acceleration structure from uint64
            requireExtensions(loc, Num_ray_tracing_EXTs, ray_tracing_EXTs, "uvec2 conversion to accelerationStructureEXT");
            return intermediate.addBuiltInFunctionCall(node->getLoc(), EOpConvUvec2ToAccStruct, true, node,
                type);
        } else
            return nullptr;

    default:
        error(loc, "unsupported construction", "", "");

        return nullptr;
    }
    newNode = intermediate.addUnaryMath(basicOp, node, node->getLoc());
    if (newNode == nullptr) {
        error(loc, "can't convert", "constructor", "");
        return nullptr;
    }

    //
    // Now, if there still isn't an operation to do the construction, and we need one, add one.
    //

    // Otherwise, skip out early.
    if (subset || (newNode != node && newNode->getType() == type))
        return newNode;

    // setAggregateOperator will insert a new node for the constructor, as needed.
    return intermediate.setAggregateOperator(newNode, op, type, loc);
}